

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

size_t __thiscall flexbuffers::Builder::EndMap(Builder *this,size_t start)

{
  pointer *ppVVar1;
  pointer pVVar2;
  iterator __position;
  long lVar3;
  size_t vec_len;
  ulong uVar4;
  anon_union_8_3_83789bcb_for_Value_0 aVar5;
  Type *pTVar6;
  size_t sVar7;
  TwoValue *__first;
  Value vec;
  Value keys;
  anon_union_8_3_83789bcb_for_Value_0 local_50;
  undefined8 uStack_48;
  Value local_40;
  
  vec_len = MapElementCount(this,start);
  pVVar2 = (this->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->stack_).
                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4;
  if (start < uVar4) {
    pTVar6 = &pVVar2[start].type_;
    sVar7 = start;
    do {
      if (*pTVar6 != FBT_KEY) {
        __assert_fail("stack_[key].type_ == FBT_KEY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                      ,0x49b,"size_t flexbuffers::Builder::EndMap(size_t)");
      }
      sVar7 = sVar7 + 2;
      pTVar6 = pTVar6 + 8;
    } while (sVar7 < uVar4);
  }
  if (vec_len != 0) {
    __first = (TwoValue *)(pVVar2 + start);
    lVar3 = 0x3f;
    if (vec_len != 0) {
      for (; vec_len >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<flexbuffers::Builder::EndMap(unsigned_long)::TwoValue*,long,__gnu_cxx::__ops::_Iter_comp_iter<flexbuffers::Builder::EndMap(unsigned_long)::_lambda(flexbuffers::Builder::EndMap(unsigned_long)::TwoValue_const&,flexbuffers::Builder::EndMap(unsigned_long)::TwoValue_const&)_1_>>
              (__first,__first + vec_len,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_aardappel[P]flatbuffers_include_flatbuffers_flexbuffers_h:1198:27)>
                )this);
    std::
    __final_insertion_sort<flexbuffers::Builder::EndMap(unsigned_long)::TwoValue*,__gnu_cxx::__ops::_Iter_comp_iter<flexbuffers::Builder::EndMap(unsigned_long)::_lambda(flexbuffers::Builder::EndMap(unsigned_long)::TwoValue_const&,flexbuffers::Builder::EndMap(unsigned_long)::TwoValue_const&)_1_>>
              (__first,__first + vec_len,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_aardappel[P]flatbuffers_include_flatbuffers_flexbuffers_h:1198:27)>
                )this);
  }
  local_40 = CreateVector(this,start,vec_len,2,true,false,(Value *)0x0);
  _local_50 = CreateVector(this,start + 1,vec_len,2,false,false,&local_40);
  aVar5 = local_50;
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::resize
            (&this->stack_,start);
  __position._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<flexbuffers::Builder::Value,std::allocator<flexbuffers::Builder::Value>>::
    _M_realloc_insert<flexbuffers::Builder::Value_const&>
              ((vector<flexbuffers::Builder::Value,std::allocator<flexbuffers::Builder::Value>> *)
               &this->stack_,__position,(Value *)&local_50);
  }
  else {
    ((__position._M_current)->field_0).i_ = (int64_t)local_50;
    (__position._M_current)->type_ = (undefined4)uStack_48;
    (__position._M_current)->min_bit_width_ = uStack_48._4_4_;
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
    local_50.i_ = aVar5.i_;
  }
  return local_50.i_;
}

Assistant:

size_t EndMap(size_t start) {
    // We should have interleaved keys and values on the stack.
    auto len = MapElementCount(start);
    // Make sure keys are all strings:
    for (auto key = start; key < stack_.size(); key += 2) {
      FLATBUFFERS_ASSERT(stack_[key].type_ == FBT_KEY);
    }
    // Now sort values, so later we can do a binary search lookup.
    // We want to sort 2 array elements at a time.
    struct TwoValue {
      Value key;
      Value val;
    };
    // TODO(wvo): strict aliasing?
    // TODO(wvo): allow the caller to indicate the data is already sorted
    // for maximum efficiency? With an assert to check sortedness to make sure
    // we're not breaking binary search.
    // Or, we can track if the map is sorted as keys are added which would be
    // be quite cheap (cheaper than checking it here), so we can skip this
    // step automatically when appliccable, and encourage people to write in
    // sorted fashion.
    // std::sort is typically already a lot faster on sorted data though.
    auto dict = reinterpret_cast<TwoValue *>(stack_.data() + start);
    std::sort(
        dict, dict + len, [&](const TwoValue &a, const TwoValue &b) -> bool {
          auto as = reinterpret_cast<const char *>(buf_.data() + a.key.u_);
          auto bs = reinterpret_cast<const char *>(buf_.data() + b.key.u_);
          auto comp = strcmp(as, bs);
          // We want to disallow duplicate keys, since this results in a
          // map where values cannot be found.
          // But we can't assert here (since we don't want to fail on
          // random JSON input) or have an error mechanism.
          // Instead, we set has_duplicate_keys_ in the builder to
          // signal this.
          // TODO: Have to check for pointer equality, as some sort
          // implementation apparently call this function with the same
          // element?? Why?
          if (!comp && &a != &b) has_duplicate_keys_ = true;
          return comp < 0;
        });
    // First create a vector out of all keys.
    // TODO(wvo): if kBuilderFlagShareKeyVectors is true, see if we can share
    // the first vector.
    auto keys = CreateVector(start, len, 2, true, false);
    auto vec = CreateVector(start + 1, len, 2, false, false, &keys);
    // Remove temp elements and return map.
    stack_.resize(start);
    stack_.push_back(vec);
    return static_cast<size_t>(vec.u_);
  }